

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O3

VOID GetSystemInfo(LPSYSTEM_INFO lpSystemInfo)

{
  FILE *__stream;
  DWORD DVar1;
  long lVar2;
  uint *puVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    DVar1 = getpagesize();
    lpSystemInfo->wProcessorArchitecture_PAL_Undefined = 0;
    lpSystemInfo->wReserved_PAL_Undefined = 0;
    lpSystemInfo->dwPageSize = DVar1;
    lpSystemInfo->dwActiveProcessorMask_PAL_Undefined = 0;
    lVar2 = sysconf(0x54);
    if ((int)(DWORD)lVar2 < 1) {
      fprintf(_stderr,"] %s %s:%d","GetSystemInfo",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/sysinfo.cpp"
              ,0x9e);
      __stream = _stderr;
      puVar3 = (uint *)__errno_location();
      fprintf(__stream,"sysconf failed for _SC_NPROCESSORS_ONLN (%d)\n",(ulong)*puVar3);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      lpSystemInfo->dwNumberOfProcessors = (DWORD)lVar2;
      lpSystemInfo->lpMaximumApplicationAddress = (LPVOID)0x800000000000;
      lpSystemInfo->lpMinimumApplicationAddress = (LPVOID)(long)(int)DVar1;
      lpSystemInfo->dwProcessorType_PAL_Undefined = 0;
      lpSystemInfo->dwAllocationGranularity = DVar1;
      lpSystemInfo->wProcessorLevel_PAL_Undefined = 0;
      lpSystemInfo->wProcessorRevision_PAL_Undefined = 0;
      return;
    }
  }
  abort();
}

Assistant:

VOID
PALAPI
GetSystemInfo(
          OUT LPSYSTEM_INFO lpSystemInfo)
{
    int nrcpus = 0;
    long pagesize;

    PERF_ENTRY(GetSystemInfo);
    ENTRY("GetSystemInfo (lpSystemInfo=%p)\n", lpSystemInfo);

    pagesize = getpagesize();

    lpSystemInfo->wProcessorArchitecture_PAL_Undefined = 0;
    lpSystemInfo->wReserved_PAL_Undefined = 0;
    lpSystemInfo->dwPageSize = pagesize;
    lpSystemInfo->dwActiveProcessorMask_PAL_Undefined = 0;

#if HAVE_SYSCONF
    nrcpus = sysconf(_SC_NPROCESSORS_ONLN);
    if (nrcpus < 1)
    {
        ASSERT("sysconf failed for _SC_NPROCESSORS_ONLN (%d)\n", errno);
    }
#elif HAVE_SYSCTL
    int rc;
    size_t sz;
    int mib[2];

    sz = sizeof(nrcpus);
    mib[0] = CTL_HW;
    mib[1] = HW_NCPU;
    rc = sysctl(mib, 2, &nrcpus, &sz, NULL, 0);
    if (rc != 0)
    {
        ASSERT("sysctl failed for HW_NCPU (%d)\n", errno);
    }
#endif // HAVE_SYSCONF

    TRACE("dwNumberOfProcessors=%d\n", nrcpus);
    lpSystemInfo->dwNumberOfProcessors = nrcpus;

// TODO: (BSD) is it a good idea to take maxOf(GetCurrentThreadStackLimits, USRSTACKXX) ?
#ifdef __APPLE__ // defined(USRSTACK64) || defined(USRSTACK)
ULONG_PTR lowl, highl;
GetCurrentThreadStackLimits(&lowl, &highl);
#ifndef PAL_MAX
#define PAL_MAX(a, b) ((a > b) ? (a) : (b))
#endif
#endif

#ifdef VM_MAXUSER_ADDRESS
    lpSystemInfo->lpMaximumApplicationAddress = (PVOID) VM_MAXUSER_ADDRESS;
#elif defined(__LINUX__)
    lpSystemInfo->lpMaximumApplicationAddress = (PVOID) MAX_PROCESS_VA_SPACE_LINUX;
#elif defined(USERLIMIT)
    lpSystemInfo->lpMaximumApplicationAddress = (PVOID) USERLIMIT;
#elif defined(_WIN64)
#if defined(_M_ARM64)
    lpSystemInfo->lpMaximumApplicationAddress = (PVOID) (1ull << 47);
#elif defined(USRSTACK64)
    lpSystemInfo->lpMaximumApplicationAddress = (PVOID) PAL_MAX(highl, USRSTACK64);
#else // !USRSTACK64
#error How come USRSTACK64 is not defined for 64bit?
#endif // USRSTACK64
#elif defined(USRSTACK)
    lpSystemInfo->lpMaximumApplicationAddress = (PVOID) PAL_MAX(highl, USRSTACK);
#else
#error The maximum application address is not known on this platform.
#endif

    lpSystemInfo->lpMinimumApplicationAddress = (PVOID) pagesize;

    lpSystemInfo->dwProcessorType_PAL_Undefined = 0;

    lpSystemInfo->dwAllocationGranularity = pagesize;

    lpSystemInfo->wProcessorLevel_PAL_Undefined = 0;
    lpSystemInfo->wProcessorRevision_PAL_Undefined = 0;

    LOGEXIT("GetSystemInfo returns VOID\n");
    PERF_EXIT(GetSystemInfo);
}